

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void helper_shilo_mips(target_ulong_conflict ac,target_ulong_conflict rs,CPUMIPSState_conflict *env)

{
  byte bVar1;
  ulong uVar2;
  uint64_t acc;
  uint64_t temp;
  int8_t rs5_0;
  CPUMIPSState_conflict *env_local;
  target_ulong_conflict rs_local;
  target_ulong_conflict ac_local;
  
  bVar1 = (char)((char)rs << 2) >> 2;
  if (bVar1 != 0) {
    uVar2 = CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]);
    if ((char)bVar1 < '\x01') {
      acc = uVar2 << (-bVar1 & 0x3f);
    }
    else {
      acc = uVar2 >> (bVar1 & 0x3f);
    }
    (env->active_tc).HI[ac] = (target_ulong_conflict)(acc >> 0x20);
    (env->active_tc).LO[ac] = (target_ulong_conflict)acc;
  }
  return;
}

Assistant:

void helper_shilo(target_ulong ac, target_ulong rs, CPUMIPSState *env)
{
    int8_t  rs5_0;
    uint64_t temp, acc;

    rs5_0 = rs & 0x3F;
    rs5_0 = (int8_t)(rs5_0 << 2) >> 2;

    if (unlikely(rs5_0 == 0)) {
        return;
    }

    acc   = (((uint64_t)env->active_tc.HI[ac] << 32) & MIPSDSP_LHI) |
            ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);

    if (rs5_0 > 0) {
        temp = acc >> rs5_0;
    } else {
        temp = acc << -rs5_0;
    }

    env->active_tc.HI[ac] = (target_ulong)(int32_t)((temp & MIPSDSP_LHI) >> 32);
    env->active_tc.LO[ac] = (target_ulong)(int32_t)(temp & MIPSDSP_LLO);
}